

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::convert(XMLAbstractDoubleFloat *this,char *strValue)

{
  int *piVar1;
  NumberFormatException *this_00;
  double dVar2;
  char *endptr;
  
  normalizeDecimalPoint(strValue);
  endptr = (char *)0x0;
  piVar1 = __errno_location();
  *piVar1 = 0;
  dVar2 = strtod(strValue,&endptr);
  this->fValue = dVar2;
  if (*endptr != '\0') {
    this_00 = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
               ,0x1ca,XMLNUM_Inv_chars,this->fMemoryManager);
    __cxa_throw(this_00,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  if (*piVar1 != 0x22) {
    return;
  }
  this->fDataConverted = true;
  if (0.0 <= dVar2) {
    if (dVar2 <= 0.0) {
      return;
    }
    if (dVar2 < 2.2250738585072014e-308) goto LAB_002602ac;
    this->fType = PosINF;
  }
  else {
    if (-2.2250738585072014e-308 < dVar2) {
LAB_002602ac:
      this->fValue = 0.0;
      return;
    }
    this->fType = NegINF;
  }
  this->fDataOverflowed = true;
  return;
}

Assistant:

void
XMLAbstractDoubleFloat::convert(char* const strValue)
{
    normalizeDecimalPoint(strValue);

    char *endptr = 0;
    errno = 0;
    fValue = strtod(strValue, &endptr);

    // check if all chars are valid char.  If they are, endptr will
    // pointer to the null terminator.
    if (*endptr != '\0')
    {
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, getMemoryManager());
    }

    // check if overflow/underflow occurs
    if (errno == ERANGE)
    {
            
        fDataConverted = true;

        if ( fValue < 0 )
        {
            if (fValue > (-1)*DBL_MIN)
            {
                fValue = 0;
            }
            else
            {
                fType = NegINF;
                fDataOverflowed = true;
            }
        }
        else if ( fValue > 0)
        {
            if (fValue < DBL_MIN )
            {
                fValue = 0;
            }
            else
            {
                fType = PosINF;
                fDataOverflowed = true;
            }
        }
    }
}